

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogLuvVGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  
  if (tag == 0x10018) {
    uVar1 = *(undefined4 *)(tif->tif_data + 4);
    uVar2 = ap->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      puVar4 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar4 + 1;
    }
    *(undefined4 *)*puVar4 = uVar1;
    return 1;
  }
  iVar3 = (**(code **)(tif->tif_data + 0x28))();
  return iVar3;
}

Assistant:

static int LogLuvVGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    LogLuvState *sp = (LogLuvState *)tif->tif_data;

    switch (tag)
    {
        case TIFFTAG_SGILOGDATAFMT:
            *va_arg(ap, int *) = sp->user_datafmt;
            return (1);
        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
}